

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O3

ngx_int_t ngx_http_complex_value
                    (ngx_http_request_t *r,ngx_http_complex_value_t *val,ngx_str_t *value)

{
  u_char *puVar1;
  long lVar2;
  code *pcVar3;
  size_t size;
  long *local_88;
  u_char *local_80;
  undefined8 uStack_78;
  size_t local_70;
  u_char *puStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  ngx_http_request_t *local_38;
  
  if (val->lengths == (void *)0x0) {
    puVar1 = (val->value).data;
    value->len = (val->value).len;
    value->data = puVar1;
  }
  else {
    ngx_http_script_flush_complex_value(r,val);
    local_50 = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_70 = 0;
    puStack_68 = (u_char *)0x0;
    local_80 = (u_char *)0x0;
    uStack_78 = 0;
    local_40 = 0;
    local_88 = (long *)val->lengths;
    uStack_48 = 1;
    pcVar3 = (code *)*local_88;
    size = 0;
    local_38 = r;
    if (pcVar3 != (code *)0x0) {
      do {
        lVar2 = (*pcVar3)(&local_88);
        size = size + lVar2;
        pcVar3 = (code *)*local_88;
      } while (pcVar3 != (code *)0x0);
    }
    value->len = size;
    local_80 = (u_char *)ngx_pnalloc(r->pool,size);
    value->data = local_80;
    if (local_80 == (u_char *)0x0) {
      return -1;
    }
    local_88 = (long *)val->values;
    local_70 = value->len;
    puStack_68 = value->data;
    pcVar3 = (code *)*local_88;
    if (pcVar3 != (code *)0x0) {
      do {
        (*pcVar3)(&local_88);
        pcVar3 = (code *)*local_88;
      } while (pcVar3 != (code *)0x0);
    }
    value->len = local_70;
    value->data = puStack_68;
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_http_complex_value(ngx_http_request_t *r, ngx_http_complex_value_t *val,
    ngx_str_t *value)
{
    size_t                        len;
    ngx_http_script_code_pt       code;
    ngx_http_script_len_code_pt   lcode;
    ngx_http_script_engine_t      e;

    if (val->lengths == NULL) {
        *value = val->value;
        return NGX_OK;
    }

    ngx_http_script_flush_complex_value(r, val);

    ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

    e.ip = val->lengths;
    e.request = r;
    e.flushed = 1;

    len = 0;

    while (*(uintptr_t *) e.ip) {
        lcode = *(ngx_http_script_len_code_pt *) e.ip;
        len += lcode(&e);
    }

    value->len = len;
    value->data = ngx_pnalloc(r->pool, len);
    if (value->data == NULL) {
        return NGX_ERROR;
    }

    e.ip = val->values;
    e.pos = value->data;
    e.buf = *value;

    while (*(uintptr_t *) e.ip) {
        code = *(ngx_http_script_code_pt *) e.ip;
        code((ngx_http_script_engine_t *) &e);
    }

    *value = e.buf;

    return NGX_OK;
}